

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Host.cpp
# Opt level: O0

void getAMDProcessorTypeAndSubtype(uint Family,uint Model,uint Features,uint *Type,uint *Subtype)

{
  uint *Subtype_local;
  uint *Type_local;
  uint Features_local;
  uint Model_local;
  uint Family_local;
  
  switch(Family) {
  case 4:
    *Type = 0x18;
    break;
  case 5:
    *Type = 0x19;
    switch(Model) {
    case 6:
    case 7:
      *Subtype = 0x14;
      break;
    case 8:
      *Subtype = 0x15;
      break;
    case 9:
    case 0xd:
      *Subtype = 0x16;
      break;
    case 10:
      *Subtype = 0x17;
    }
    break;
  case 6:
    if ((Features & 8) == 0) {
      *Type = 0x1a;
    }
    else {
      *Type = 0x1b;
    }
    break;
  default:
    break;
  case 0xf:
    if ((Features & 0x20) == 0) {
      *Type = 0x1c;
    }
    else {
      *Type = 0x1d;
    }
    break;
  case 0x10:
    *Type = 4;
    if (Model == 2) {
      *Subtype = 4;
    }
    else if (Model == 4) {
      *Subtype = 5;
    }
    else if (Model == 8) {
      *Subtype = 6;
    }
    break;
  case 0x14:
    *Type = 8;
    break;
  case 0x15:
    *Type = 5;
    if ((Model < 0x60) || (0x7f < Model)) {
      if ((Model < 0x30) || (0x3f < Model)) {
        if (((Model < 0x10) || (0x1f < Model)) && (Model != 2)) {
          if (Model < 0x10) {
            *Subtype = 7;
          }
        }
        else {
          *Subtype = 8;
        }
      }
      else {
        *Subtype = 9;
      }
    }
    else {
      *Subtype = 10;
    }
    break;
  case 0x16:
    *Type = 9;
    break;
  case 0x17:
    *Type = 10;
    *Subtype = 0xb;
  }
  return;
}

Assistant:

static void getAMDProcessorTypeAndSubtype(unsigned Family, unsigned Model,
                                          unsigned Features, unsigned *Type,
                                          unsigned *Subtype) {
  // FIXME: this poorly matches the generated SubtargetFeatureKV table.  There
  // appears to be no way to generate the wide variety of AMD-specific targets
  // from the information returned from CPUID.
  switch (Family) {
  case 4:
    *Type = X86::AMD_i486;
    break;
  case 5:
    *Type = X86::AMDPENTIUM;
    switch (Model) {
    case 6:
    case 7:
      *Subtype = X86::AMDPENTIUM_K6;
      break; // "k6"
    case 8:
      *Subtype = X86::AMDPENTIUM_K62;
      break; // "k6-2"
    case 9:
    case 13:
      *Subtype = X86::AMDPENTIUM_K63;
      break; // "k6-3"
    case 10:
      *Subtype = X86::AMDPENTIUM_GEODE;
      break; // "geode"
    }
    break;
  case 6:
    if (Features & (1 << X86::FEATURE_SSE)) {
      *Type = X86::AMD_ATHLON_XP;
      break; // "athlon-xp"
    }
    *Type = X86::AMD_ATHLON;
    break; // "athlon"
  case 15:
    if (Features & (1 << X86::FEATURE_SSE3)) {
      *Type = X86::AMD_K8SSE3;
      break; // "k8-sse3"
    }
    *Type = X86::AMD_K8;
    break; // "k8"
  case 16:
    *Type = X86::AMDFAM10H; // "amdfam10"
    switch (Model) {
    case 2:
      *Subtype = X86::AMDFAM10H_BARCELONA;
      break;
    case 4:
      *Subtype = X86::AMDFAM10H_SHANGHAI;
      break;
    case 8:
      *Subtype = X86::AMDFAM10H_ISTANBUL;
      break;
    }
    break;
  case 20:
    *Type = X86::AMD_BTVER1;
    break; // "btver1";
  case 21:
    *Type = X86::AMDFAM15H;
    if (Model >= 0x60 && Model <= 0x7f) {
      *Subtype = X86::AMDFAM15H_BDVER4;
      break; // "bdver4"; 60h-7Fh: Excavator
    }
    if (Model >= 0x30 && Model <= 0x3f) {
      *Subtype = X86::AMDFAM15H_BDVER3;
      break; // "bdver3"; 30h-3Fh: Steamroller
    }
    if ((Model >= 0x10 && Model <= 0x1f) || Model == 0x02) {
      *Subtype = X86::AMDFAM15H_BDVER2;
      break; // "bdver2"; 02h, 10h-1Fh: Piledriver
    }
    if (Model <= 0x0f) {
      *Subtype = X86::AMDFAM15H_BDVER1;
      break; // "bdver1"; 00h-0Fh: Bulldozer
    }
    break;
  case 22:
    *Type = X86::AMD_BTVER2;
    break; // "btver2"
  case 23:
    *Type = X86::AMDFAM17H;
    *Subtype = X86::AMDFAM17H_ZNVER1;
    break;
  default:
    break; // "generic"
  }
}